

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

string * __thiscall json::Object::stringify_abi_cxx11_(string *__return_storage_ptr__,Object *this)

{
  ostream *poVar1;
  Type *pTVar2;
  _Base_ptr p_Var3;
  stringstream stream;
  string local_1d8 [32];
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::operator<<(local_1a8,"{");
  for (p_Var3 = (this->fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->fields)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    if (p_Var3 != (this->fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
      std::operator<<(local_1a8,", ");
    }
    poVar1 = std::operator<<(local_1a8,"\"");
    poVar1 = std::operator<<(poVar1,(string *)(p_Var3 + 1));
    poVar1 = std::operator<<(poVar1,"\"");
    poVar1 = std::operator<<(poVar1,": ");
    pTVar2 = common::XPtr<json::Type>::operator->((XPtr<json::Type> *)(p_Var3 + 2));
    (*pTVar2->_vptr_Type[1])(local_1d8,pTVar2);
    std::operator<<(poVar1,local_1d8);
    std::__cxx11::string::~string(local_1d8);
  }
  std::operator<<(local_1a8,"}");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string stringify() const {
            std::stringstream stream;
            stream << "{";
            for_each_c (Fields, fields, field) {
                if (field != fields.begin()) stream << ", ";
                stream << "\"" << field->first << "\"" << ": " << field->second->stringify();
            }
            stream << "}";
            return stream.str();
        }